

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcapimin.c
# Opt level: O0

void jpeg_write_marker(j_compress_ptr cinfo,int marker,JOCTET *dataptr,uint datalen)

{
  _func_void_j_compress_ptr_int *p_Var1;
  _func_void_j_compress_ptr_int *write_marker_byte;
  JOCTET *pJStack_20;
  uint datalen_local;
  JOCTET *dataptr_local;
  int marker_local;
  j_compress_ptr cinfo_local;
  
  if ((cinfo->next_scanline != 0) ||
     (((cinfo->global_state != 0x65 && (cinfo->global_state != 0x66)) &&
      (cinfo->global_state != 0x67)))) {
    cinfo->err->msg_code = 0x15;
    (cinfo->err->msg_parm).i[0] = cinfo->global_state;
    (*cinfo->err->error_exit)((j_common_ptr)cinfo);
  }
  (*cinfo->marker->write_marker_header)(cinfo,marker,datalen);
  p_Var1 = cinfo->marker->write_marker_byte;
  write_marker_byte._4_4_ = datalen;
  pJStack_20 = dataptr;
  while (write_marker_byte._4_4_ != 0) {
    (*p_Var1)(cinfo,(int)*pJStack_20);
    pJStack_20 = pJStack_20 + 1;
    write_marker_byte._4_4_ = write_marker_byte._4_4_ - 1;
  }
  return;
}

Assistant:

GLOBAL(void)
jpeg_write_marker (j_compress_ptr cinfo, int marker,
		   const JOCTET *dataptr, unsigned int datalen)
{
  JMETHOD(void, write_marker_byte, (j_compress_ptr info, int val));

  if (cinfo->next_scanline != 0 ||
      (cinfo->global_state != CSTATE_SCANNING &&
       cinfo->global_state != CSTATE_RAW_OK &&
       cinfo->global_state != CSTATE_WRCOEFS))
    ERREXIT1(cinfo, JERR_BAD_STATE, cinfo->global_state);

  (*cinfo->marker->write_marker_header) (cinfo, marker, datalen);
  write_marker_byte = cinfo->marker->write_marker_byte;	/* copy for speed */
  while (datalen--) {
    (*write_marker_byte) (cinfo, *dataptr);
    dataptr++;
  }
}